

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

void __thiscall QAccessibleTableCell::setText(QAccessibleTableCell *this,Text param_1,QString *text)

{
  char cVar1;
  ulong uVar2;
  QAbstractItemModel *pQVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QModelIndex local_60;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x10))(this,CONCAT44(in_register_00000034,param_1));
  if (cVar1 != '\0') {
    uVar2 = QPersistentModelIndex::flags();
    if ((uVar2 & 2) != 0) {
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&this->m_index);
      ::QVariant::QVariant(&local_48,(QString *)text);
      (**(code **)(*(long *)pQVar3 + 0x98))(pQVar3,&local_60,&local_48,2);
      ::QVariant::~QVariant(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTableCell::setText(QAccessible::Text /*t*/, const QString &text)
{
    if (!isValid() || !(m_index.flags() & Qt::ItemIsEditable))
        return;
    view->model()->setData(m_index, text);
}